

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_ManExploreCut(Sbd_Man_t *p,int Pivot,int nLeaves,int *pLeaves,int *pnStrs,Sbd_Str_t *Strs,
                     int *pFreeVar)

{
  sat_solver *psVar1;
  Sbd_Par_t *pSVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  word wVar9;
  abctime aVar10;
  abctime aVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  int *piVar21;
  ulong uVar22;
  uint uVar23;
  Sbd_Str_t *pSVar24;
  ulong uVar25;
  ulong local_140;
  ulong local_130;
  int pNodesTop [10];
  timespec ts_5;
  int pNodesBot [10];
  int pNodesBot1 [10];
  int pNodesBot2 [10];
  
  clock_gettime(3,(timespec *)pNodesTop);
  if (((-1 < Pivot) && (Pivot < p->vObj2Var->nSize)) && (Pivot < p->vLutLevs->nSize)) {
    iVar7 = p->vObj2Var->pArray[(uint)Pivot];
    iVar6 = p->vLutLevs->pArray[(uint)Pivot];
    uVar22 = (ulong)(uint)nLeaves;
    if (0 < nLeaves) {
      uVar15 = 0;
      uVar23 = nLeaves;
      do {
        uVar23 = uVar23 - 1;
        p->vDivSet->nSize = 0;
        uVar25 = 0;
        do {
          if (uVar23 != uVar25) {
            uVar18 = pLeaves[uVar25];
            if ((ulong)uVar18 != 0xffffffff) {
              if (((int)uVar18 < 0) || (p->vObj2Var->nSize <= (int)uVar18)) goto LAB_0053bece;
              Vec_IntPush(p->vDivSet,p->vObj2Var->pArray[uVar18]);
            }
          }
          uVar25 = uVar25 + 1;
        } while (uVar22 != uVar25);
        if (nLeaves <= p->vDivSet->nSize) {
          __assert_fail("Vec_IntSize(p->vDivSet) < nLeaves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x519,
                        "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                       );
        }
        iVar5 = clock_gettime(3,(timespec *)pNodesTop);
        if (iVar5 < 0) {
          lVar13 = 1;
        }
        else {
          lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)pNodesTop._8_8_),8);
          lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + pNodesTop._0_8_ * -1000000;
        }
        psVar1 = p->pSat;
        iVar5 = *pFreeVar;
        *pFreeVar = iVar5 + 1;
        wVar9 = Sbd_ManSolve(psVar1,iVar7,iVar5,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
        iVar5 = clock_gettime(3,(timespec *)pNodesTop);
        if (iVar5 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = (long)pNodesTop._8_8_ / 1000 + pNodesTop._0_8_ * 1000000;
        }
        p->timeSat = p->timeSat + lVar14 + lVar13;
        if (wVar9 == 0x8765432187654321) {
          iVar5 = pLeaves[uVar22 + ~uVar15];
          if (((long)iVar5 < 0) || (p->vLutLevs->nSize <= iVar5)) goto LAB_0053bece;
          if (-2 < p->vLutLevs->pArray[iVar5] - iVar6) goto LAB_0053beb6;
        }
        else if (wVar9 == 0x1234567812345678) {
          printf("Node %d:  Undecided.\n");
        }
        else {
          pLeaves[uVar22 + ~uVar15] = -1;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar22);
    }
    p->vDivSet->nSize = 0;
    if (0 < nLeaves) {
      uVar15 = 0;
      do {
        if (pLeaves[uVar15] != -1) {
          Vec_IntPush(p->vDivSet,pLeaves[uVar15]);
        }
        uVar15 = uVar15 + 1;
      } while (uVar22 != uVar15);
    }
    pSVar2 = p->pPars;
    pVVar3 = p->vDivSet;
    if (pSVar2->nLutSize < pVVar3->nSize) {
      if (pVVar3->nSize < 1) {
        lVar13 = 0;
        local_130 = 0;
        uVar22 = 0;
        uVar23 = 0;
        local_140 = 0;
      }
      else {
        piVar16 = pVVar3->pArray;
        pVVar4 = p->vLutLevs;
        lVar13 = 0;
        local_140 = 0;
        uVar23 = 0;
        uVar22 = 0;
        local_130 = 0;
        do {
          iVar7 = piVar16[lVar13];
          lVar14 = (long)iVar7;
          if ((lVar14 < 0) || (pVVar4->nSize <= iVar7)) goto LAB_0053bece;
          iVar5 = pVVar4->pArray[lVar14] - iVar6;
          if (iVar5 < -1) {
            if (iVar5 == -2) {
              iVar19 = (int)local_140;
              local_140 = (ulong)(iVar19 + 1);
              piVar21 = pNodesTop;
            }
            else {
              lVar20 = (long)(int)uVar23;
              uVar23 = uVar23 + 1;
              pNodesBot[lVar20] = (int)lVar13;
              if (iVar5 == -3) {
                iVar19 = (int)local_130;
                local_130 = (ulong)(iVar19 + 1);
                piVar21 = pNodesBot1;
              }
              else {
                iVar19 = (int)uVar22;
                uVar22 = (ulong)(iVar19 + 1);
                piVar21 = pNodesBot2;
              }
            }
            piVar21[iVar19] = (int)lVar13;
            if (p->vObj2Var->nSize <= iVar7) goto LAB_0053bece;
            piVar16[lVar13] = p->vObj2Var->pArray[lVar14];
          }
        } while ((iVar5 < -1) && (lVar13 = lVar13 + 1, lVar13 < pVVar3->nSize));
      }
      iVar6 = (int)uVar22;
      iVar5 = (int)local_130;
      if (uVar23 != iVar6 + iVar5) {
        __assert_fail("nNodesBot == nNodesBot1 + nNodesBot2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                      ,0x55e,
                      "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                     );
      }
      iVar19 = pVVar3->nSize;
      iVar7 = 0;
      if (iVar19 <= (int)lVar13) {
        iVar8 = pSVar2->nLutSize;
        iVar7 = 0;
        if ((int)local_140 < iVar8) {
          iVar7 = 0;
          if (SBORROW4(iVar19,iVar8 * 2) != iVar19 + iVar8 * -2 < 0) {
            iVar19 = uVar23 - iVar8;
            if (iVar19 == 0 || (int)uVar23 < iVar8) {
              iVar19 = 0;
            }
            else {
              piVar16 = pNodesBot + (long)(int)uVar23 + -1;
              lVar13 = 0;
              do {
                pNodesTop[(int)local_140 + lVar13] = *piVar16;
                lVar13 = lVar13 + 1;
                piVar16 = piVar16 + -1;
                iVar7 = (int)lVar13;
              } while (uVar23 - iVar8 != iVar7);
              if (uVar23 - iVar8 != iVar7) {
                __assert_fail("nNodesBot == p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x56c,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              uVar23 = uVar23 - iVar7;
              local_140 = local_140 + lVar13;
            }
            if (iVar8 < (int)uVar23) {
              __assert_fail("nNodesBot <= p->pPars->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x56e,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            uVar18 = (uint)local_140;
            if (iVar8 <= (int)uVar18) {
              __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x56f,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            Strs->fLut = 1;
            Strs->nVarIns = iVar8;
            if ((int)uVar18 < 1) {
              uVar17 = 0;
            }
            else {
              memcpy(Strs->VarIns,pNodesTop,(local_140 & 0xffffffff) << 2);
              uVar17 = uVar18;
            }
            if ((int)uVar17 < pSVar2->nLutSize) {
              uVar15 = (ulong)uVar17;
              do {
                Strs->VarIns[uVar15] = (1 - uVar18) + (int)uVar15 + pVVar3->nSize;
                uVar15 = uVar15 + 1;
              } while ((int)uVar15 < pSVar2->nLutSize);
            }
            Strs->Res = 0;
            Strs[1].fLut = 1;
            Strs[1].nVarIns = uVar23;
            if (0 < (int)uVar23) {
              memcpy(Strs[1].VarIns,pNodesBot,(ulong)uVar23 * 4);
            }
            Strs[1].Res = 0;
            uVar17 = ~uVar18 + pSVar2->nLutSize;
            if (3 < uVar17) {
              __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                            ,0x580,
                            "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                           );
            }
            if (uVar17 != 0) {
              lVar13 = 0;
              do {
                *(undefined4 *)((long)Strs[2].VarIns + lVar13 + -8) = 0;
                *(uint *)((long)Strs[2].VarIns + lVar13 + -4) = uVar23;
                if (0 < (int)uVar23) {
                  memcpy((void *)((long)Strs[2].VarIns + lVar13),pNodesBot,(ulong)uVar23 << 2);
                }
                *(undefined8 *)((long)Strs[2].VarIns + lVar13 + 0x28) = 0;
                lVar13 = lVar13 + 0x38;
              } while ((ulong)uVar17 * 0x38 - lVar13 != 0);
            }
            *pnStrs = uVar17 + 2;
            iVar7 = clock_gettime(3,(timespec *)&ts_5);
            if (iVar7 < 0) {
              lVar13 = 1;
            }
            else {
              lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_5.tv_nsec),8);
              lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts_5.tv_sec * -1000000;
            }
            iVar7 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                                     p->vRoots,p->vDivSet,*pnStrs,Strs);
            iVar8 = clock_gettime(3,(timespec *)&ts_5);
            if (iVar8 < 0) {
              lVar14 = -1;
            }
            else {
              lVar14 = ts_5.tv_nsec / 1000 + ts_5.tv_sec * 1000000;
            }
            p->timeQbf = p->timeQbf + lVar14 + lVar13;
            if (iVar7 != 0) {
              p->nLuts[2] = p->nLuts[2] + 1;
            }
            if (iVar19 != 0) {
              piVar16 = pNodesTop + (long)(int)uVar18 + -1;
              lVar13 = 0;
              do {
                pNodesBot[(int)uVar23 + lVar13] = *piVar16;
                lVar13 = lVar13 + 1;
                piVar16 = piVar16 + -1;
                iVar8 = (int)lVar13;
              } while (iVar19 != iVar8);
              uVar23 = uVar23 + iVar8;
              local_140 = (ulong)(uVar18 - iVar8);
            }
          }
          if (iVar7 == 0) {
            pSVar2 = p->pPars;
            iVar7 = 0;
            if (2 < pSVar2->nLutNum) {
              pVVar3 = p->vDivSet;
              iVar19 = pSVar2->nLutSize;
              if (iVar19 * 2 + -1 <= pVVar3->nSize) {
                iVar7 = 0;
                if ((int)local_140 <= iVar19 + -2) {
                  iVar8 = uVar23 + iVar19 * -2;
                  if (iVar8 == 0 || SBORROW4(uVar23,iVar19 * 2) != iVar8 < 0) {
                    iVar8 = 0;
                  }
                  else {
                    piVar16 = pNodesBot + (long)(int)uVar23 + -1;
                    lVar13 = 0;
                    do {
                      pNodesTop[(int)local_140 + lVar13] = *piVar16;
                      lVar13 = lVar13 + 1;
                      piVar16 = piVar16 + -1;
                      iVar7 = (int)lVar13;
                    } while (iVar19 * -2 + uVar23 != iVar7);
                    if (uVar23 + iVar19 * -2 != iVar7) {
                      __assert_fail("nNodesBot == 2*p->pPars->nLutSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                    ,0x5a4,
                                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                   );
                    }
                    uVar23 = uVar23 - iVar7;
                    local_140 = (local_140 & 0xffffffff) + lVar13;
                  }
                  if ((int)uVar23 <= iVar19) {
                    __assert_fail("nNodesBot > p->pPars->nLutSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                  ,0x5a6,
                                  "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                 );
                  }
                  if (iVar19 * 2 < (int)uVar23) {
                    __assert_fail("nNodesBot <= 2*p->pPars->nLutSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                  ,0x5a7,
                                  "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                 );
                  }
                  uVar18 = (uint)local_140;
                  if (iVar19 + -2 < (int)uVar18) {
                    __assert_fail("nNodesTop <= p->pPars->nLutSize-2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                  ,0x5a8,
                                  "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                 );
                  }
                  Strs->fLut = 1;
                  Strs->nVarIns = iVar19;
                  if ((int)uVar18 < 1) {
                    uVar17 = 0;
                  }
                  else {
                    memcpy(Strs->VarIns,pNodesTop,(local_140 & 0xffffffff) << 2);
                    uVar17 = uVar18;
                  }
                  uVar12 = pSVar2->nLutSize;
                  if ((int)uVar17 < (int)uVar12) {
                    uVar15 = (ulong)uVar17;
                    do {
                      Strs->VarIns[uVar15] = (1 - uVar18) + (int)uVar15 + pVVar3->nSize;
                      uVar15 = uVar15 + 1;
                      uVar12 = pSVar2->nLutSize;
                    } while ((int)uVar15 < (int)uVar12);
                  }
                  Strs->Res = 0;
                  Strs[1].fLut = 1;
                  Strs[1].nVarIns = uVar12;
                  if (0 < (int)uVar12) {
                    memcpy(Strs[1].VarIns,pNodesBot,(ulong)uVar12 << 2);
                  }
                  Strs[1].Res = 0;
                  Strs[2].fLut = 1;
                  iVar7 = pSVar2->nLutSize;
                  Strs[2].nVarIns = iVar7;
                  if (0 < (long)iVar7) {
                    lVar13 = 0;
                    do {
                      Strs[2].VarIns[lVar13] =
                           pNodesBot[(int)((uVar23 + (int)lVar13) - pSVar2->nLutSize)];
                      lVar13 = lVar13 + 1;
                    } while (iVar7 != lVar13);
                  }
                  Strs[2].Res = 0;
                  iVar7 = pSVar2->nLutSize - uVar18;
                  uVar17 = iVar7 - 2;
                  if (2 < uVar17) {
                    __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                  ,0x5bf,
                                  "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                 );
                  }
                  if (uVar17 != 0) {
                    lVar13 = 0;
                    do {
                      *(undefined4 *)((long)Strs[3].VarIns + lVar13 + -8) = 0;
                      *(uint *)((long)Strs[3].VarIns + lVar13 + -4) = uVar23;
                      if (0 < (int)uVar23) {
                        memcpy((void *)((long)Strs[3].VarIns + lVar13),pNodesBot,(ulong)uVar23 << 2)
                        ;
                      }
                      *(undefined8 *)((long)Strs[3].VarIns + lVar13 + 0x28) = 0;
                      lVar13 = lVar13 + 0x38;
                    } while ((ulong)uVar17 * 0x38 - lVar13 != 0);
                  }
                  *pnStrs = iVar7 + 1;
                  aVar10 = Abc_Clock();
                  iVar7 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo
                                           ,p->vRoots,p->vDivSet,*pnStrs,Strs);
                  aVar11 = Abc_Clock();
                  p->timeQbf = p->timeQbf + (aVar11 - aVar10);
                  if (iVar7 != 0) {
                    p->nLuts[3] = p->nLuts[3] + 1;
                  }
                  if (iVar8 != 0) {
                    piVar16 = pNodesTop + (long)(int)uVar18 + -1;
                    lVar13 = 0;
                    do {
                      pNodesBot[(int)uVar23 + lVar13] = *piVar16;
                      lVar13 = lVar13 + 1;
                      piVar16 = piVar16 + -1;
                    } while (iVar8 != (int)lVar13);
                    local_140 = (ulong)(uVar18 - (int)lVar13);
                  }
                }
                if (iVar7 == 0) {
                  pSVar2 = p->pPars;
                  iVar7 = pSVar2->nLutSize;
                  if ((int)local_140 + iVar5 <= iVar7 * 2 + -2) {
                    if (iVar7 < iVar6) {
                      lVar14 = (long)iVar6;
                      lVar13 = 0;
                      do {
                        lVar20 = lVar14 + -1;
                        lVar14 = lVar14 + -1;
                        pNodesBot1[iVar5 + lVar13] = pNodesBot2[lVar20];
                        lVar13 = lVar13 + 1;
                      } while (iVar7 < lVar14);
                      if (iVar6 - iVar7 != (int)lVar13) {
                        __assert_fail("nNodesBot2 == p->pPars->nLutSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                      ,0x5dd,
                                      "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                     );
                      }
                      local_130 = local_130 + lVar13;
                      uVar22 = uVar22 - lVar13;
                    }
                    iVar6 = (int)local_130;
                    if (iVar7 <= iVar6) {
                      lVar14 = (long)iVar6 + 1;
                      lVar13 = 0;
                      do {
                        pNodesTop[(int)local_140 + lVar13] = pNodesBot1[lVar14 + -2];
                        lVar13 = lVar13 + 1;
                        lVar14 = lVar14 + -1;
                      } while (iVar7 < lVar14);
                      if ((iVar6 - iVar7) + 1 != (int)lVar13) {
                        __assert_fail("nNodesBot1 == p->pPars->nLutSize-1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                      ,0x5e3,
                                      "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                     );
                      }
                      local_130 = (local_130 & 0xffffffff) - lVar13;
                      local_140 = (local_140 & 0xffffffff) + lVar13;
                    }
                    iVar6 = (int)uVar22;
                    if (iVar7 < iVar6) {
                      __assert_fail("nNodesBot2 <= p->pPars->nLutSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                    ,0x5e5,
                                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                   );
                    }
                    if (iVar7 <= (int)(uint)local_130) {
                      __assert_fail("nNodesBot1 <= p->pPars->nLutSize-1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                    ,0x5e6,
                                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                   );
                    }
                    uVar23 = (uint)local_140;
                    if (iVar7 <= (int)uVar23) {
                      __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                    ,0x5e7,
                                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                   );
                    }
                    Strs->fLut = 1;
                    Strs->nVarIns = iVar7;
                    if ((int)uVar23 < 1) {
                      local_140 = 0;
                    }
                    else {
                      memcpy(Strs->VarIns,pNodesTop,(local_140 & 0xffffffff) << 2);
                      local_140 = local_140 & 0xffffffff;
                    }
                    pVVar3 = p->vDivSet;
                    Strs->VarIns[local_140] = pVVar3->nSize + 1;
                    iVar7 = pSVar2->nLutSize;
                    if ((int)local_140 + 1 < iVar7) {
                      do {
                        iVar5 = (int)local_140;
                        Strs->VarIns[local_140 + 1] = (3 - uVar23) + iVar5 + pVVar3->nSize;
                        iVar7 = pSVar2->nLutSize;
                        local_140 = local_140 + 1;
                      } while (iVar5 + 2 < iVar7);
                    }
                    Strs->Res = 0;
                    Strs[1].fLut = 1;
                    Strs[1].nVarIns = iVar7;
                    if ((int)(uint)local_130 < 1) {
                      uVar15 = 0;
                    }
                    else {
                      memcpy(Strs[1].VarIns,pNodesBot1,(local_130 & 0xffffffff) * 4);
                      uVar15 = local_130 & 0xffffffff;
                    }
                    Strs[1].VarIns[uVar15] = pVVar3->nSize + 2;
                    iVar5 = pSVar2->nLutSize;
                    if ((int)uVar15 + 1 < iVar5) {
                      iVar19 = ((((int)uVar15 + iVar7) - uVar23) - (uint)local_130) + 2;
                      do {
                        Strs[1].VarIns[uVar15 + 1] = pVVar3->nSize + iVar19;
                        iVar5 = pSVar2->nLutSize;
                        iVar19 = iVar19 + 1;
                        iVar8 = (int)uVar15;
                        uVar15 = uVar15 + 1;
                      } while (iVar8 + 2 < iVar5);
                    }
                    Strs[1].Res = 0;
                    Strs[2].fLut = 1;
                    Strs[2].nVarIns = iVar6;
                    if (0 < iVar6) {
                      memcpy(Strs[2].VarIns,pNodesBot2,(uVar22 & 0xffffffff) * 4);
                    }
                    Strs[2].Res = 0;
                    uVar18 = ~(uint)local_130 + iVar7 + ~uVar23 + iVar5;
                    if (3 < uVar18) {
                      __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                    ,0x604,
                                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                   );
                    }
                    if (uVar18 != 0) {
                      pSVar24 = Strs + 3;
                      uVar15 = 0;
                      do {
                        pSVar24->fLut = 0;
                        pSVar24->nVarIns = iVar6;
                        if (0 < iVar6) {
                          memcpy(pSVar24->VarIns,pNodesBot2,(uVar22 & 0xffffffff) << 2);
                        }
                        pSVar24->Res = 0;
                        if (((long)uVar15 < (long)(int)(iVar7 + ~uVar23)) &&
                           (pSVar24->nVarIns = pSVar24->nVarIns + (uint)local_130,
                           0 < (int)(uint)local_130)) {
                          memcpy(pSVar24->VarIns + iVar6,pNodesBot1,(local_130 & 0xffffffff) << 2);
                        }
                        uVar15 = uVar15 + 1;
                        pSVar24 = pSVar24 + 1;
                      } while (uVar15 < uVar18);
                    }
                    *pnStrs = uVar18 + 3;
                    aVar10 = Abc_Clock();
                    iVar7 = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,
                                             p->vTfo,p->vRoots,p->vDivSet,*pnStrs,Strs);
                    aVar11 = Abc_Clock();
                    p->timeQbf = p->timeQbf + (aVar11 - aVar10);
                    if (iVar7 != 0) {
                      p->nLuts[4] = p->nLuts[4] + 1;
                      return iVar7;
                    }
                  }
LAB_0053beb6:
                  iVar7 = 0;
                }
              }
            }
          }
        }
      }
    }
    else {
      *pnStrs = 1;
      if (0 < pVVar3->nSize) {
        piVar16 = pVVar3->pArray;
        pVVar4 = p->vObj2Var;
        lVar13 = 0;
        do {
          iVar6 = piVar16[lVar13];
          if (((long)iVar6 < 0) || (pVVar4->nSize <= iVar6)) goto LAB_0053bece;
          piVar16[lVar13] = pVVar4->pArray[iVar6];
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar3->nSize);
      }
      iVar6 = clock_gettime(3,(timespec *)pNodesTop);
      if (iVar6 < 0) {
        lVar13 = 1;
      }
      else {
        lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)pNodesTop._8_8_),8);
        lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + pNodesTop._0_8_ * -1000000;
      }
      psVar1 = p->pSat;
      iVar6 = *pFreeVar;
      *pFreeVar = iVar6 + 1;
      wVar9 = Sbd_ManSolve(psVar1,iVar7,iVar6,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
      iVar7 = clock_gettime(3,(timespec *)pNodesTop);
      if (iVar7 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = (long)pNodesTop._8_8_ / 1000 + pNodesTop._0_8_ * 1000000;
      }
      p->timeSat = p->timeSat + lVar14 + lVar13;
      if (wVar9 == 0x8765432187654321) {
        iVar7 = 0;
        printf("The cut at node %d is not topological.\n",(ulong)(uint)p->Pivot);
      }
      else {
        if (wVar9 == 0x1234567812345678) {
          __assert_fail("Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x53e,
                        "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                       );
        }
        Strs->fLut = 1;
        iVar7 = p->vDivSet->nSize;
        Strs->nVarIns = iVar7;
        if (0 < (long)iVar7) {
          lVar13 = 0;
          do {
            Strs->VarIns[lVar13] = (int)lVar13;
            lVar13 = lVar13 + 1;
          } while (iVar7 != lVar13);
        }
        Strs->Res = wVar9;
        p->nLuts[1] = p->nLuts[1] + 1;
        iVar7 = 1;
      }
    }
    return iVar7;
  }
LAB_0053bece:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManExploreCut( Sbd_Man_t * p, int Pivot, int nLeaves, int * pLeaves, int * pnStrs, Sbd_Str_t * Strs, int * pFreeVar )
{
    abctime clk = Abc_Clock();
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int Delay = Vec_IntEntry( p->vLutLevs, Pivot );
    int pNodesTop[SBD_DIV_MAX], pNodesBot[SBD_DIV_MAX], pNodesBot1[SBD_DIV_MAX], pNodesBot2[SBD_DIV_MAX];
    int nNodesTop = 0, nNodesBot = 0, nNodesBot1 = 0, nNodesBot2 = 0, nNodesDiff = 0, nNodesDiff1 = 0, nNodesDiff2 = 0;
    int i, k, iObj, nIters, RetValue = 0;

    // try to remove fanins
    for ( nIters = 0; nIters < nLeaves; nIters++ )
    {
        word Truth;
        // try to remove one variable from divisors
        Vec_IntClear( p->vDivSet );
        for ( i = 0; i < nLeaves; i++ )
            if ( i != nLeaves-1-nIters && pLeaves[i] != -1 )
                Vec_IntPush( p->vDivSet, Vec_IntEntry(p->vObj2Var, pLeaves[i]) );
        assert( Vec_IntSize(p->vDivSet) < nLeaves );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( Truth == SBD_SAT_SAT )
        {
            int DelayDiff = Vec_IntEntry(p->vLutLevs, pLeaves[nLeaves-1-nIters]) - Delay;
            if ( DelayDiff > -2 )
                return 0;
        }
        else
            pLeaves[nLeaves-1-nIters] = -1;
    }
    Vec_IntClear( p->vDivSet );
    for ( i = 0; i < nLeaves; i++ )
        if ( pLeaves[i] != -1 )
            Vec_IntPush( p->vDivSet, pLeaves[i] );
    //printf( "Reduced %d -> %d\n", nLeaves, Vec_IntSize(p->vDivSet) );
    if ( Vec_IntSize(p->vDivSet) <= p->pPars->nLutSize )
    {
        word Truth;
        *pnStrs = 1;
        // remap divisors
        Vec_IntForEachEntry( p->vDivSet, iObj, i )
            Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_SAT )
        {
            printf( "The cut at node %d is not topological.\n", p->Pivot );
            return 0;
        }
        assert( Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT );
        // create structure
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        p->nLuts[1]++;
        //Extra_PrintBinary( stdout, (unsigned *)&Truth, 1 << Strs->nVarIns ), printf( "\n" );
        return 1;
    }
    assert( Vec_IntSize(p->vDivSet) > p->pPars->nLutSize );

    // count number of nodes on each level
    nNodesTop = nNodesBot = nNodesBot1 = nNodesBot2 = 0;
    Vec_IntForEachEntry( p->vDivSet, iObj, i )
    {
        int DelayDiff = Vec_IntEntry(p->vLutLevs, iObj) - Delay;
        if ( DelayDiff > -2 )
            break;
        if ( DelayDiff == -2 )
            pNodesTop[nNodesTop++] = i;
        else // if ( DelayDiff < -2 )
        {
            pNodesBot[nNodesBot++] = i;
            if ( DelayDiff == -3 )
                pNodesBot1[nNodesBot1++] = i;
            else // if ( DelayDiff < -3 )
                pNodesBot2[nNodesBot2++] = i;
        }
        Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
    }
    assert( nNodesBot == nNodesBot1 + nNodesBot2 );
    if ( i < Vec_IntSize(p->vDivSet) )
        return 0;
    if ( nNodesTop > p->pPars->nLutSize-1 )
        return 0;

    // try 44
    if ( Vec_IntSize(p->vDivSet) <= 2*p->pPars->nLutSize-1 )
    {
        int nMoved = 0;
        if ( nNodesBot > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == p->pPars->nLutSize );
        }
        assert( nNodesBot <= p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = nNodesBot;
        for ( i = 0; i < nNodesBot; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        nNodesDiff = p->pPars->nLutSize-1 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[2+k].fLut = 0;
            Strs[2+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[2+k].VarIns[i] = pNodesBot[i];
            Strs[2+k].Res = 0;
        }

        *pnStrs = 2 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[2]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }

    if ( RetValue )
        return RetValue;
    if ( p->pPars->nLutNum < 3 )
        return 0;
    if ( Vec_IntSize(p->vDivSet) < 2*p->pPars->nLutSize-1 )
        return 0;

    // try 444 -- LUT(LUT, LUT)
    if ( nNodesTop <= p->pPars->nLutSize-2 )
    {
        int nMoved = 0;
        if ( nNodesBot > 2*p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > 2*p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == 2*p->pPars->nLutSize );
        }
        assert( nNodesBot > p->pPars->nLutSize );
        assert( nNodesBot <= 2*p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-2 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[1].nVarIns; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot[nNodesBot-p->pPars->nLutSize+i];
        Strs[2].Res = 0;

        nNodesDiff = p->pPars->nLutSize-2 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 2 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[3+k].VarIns[i] = pNodesBot[i];
            Strs[3+k].Res = 0;
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[3]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }
    if ( RetValue )
        return RetValue;

    // try 444 -- LUT(LUT(LUT))
    if ( nNodesBot1 + nNodesTop <= 2*p->pPars->nLutSize-2 )
    {
        if ( nNodesBot2 > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot2 > p->pPars->nLutSize )
                pNodesBot1[nNodesBot1++] = pNodesBot2[--nNodesBot2];
            assert( nNodesBot2 == p->pPars->nLutSize );
        }
        if ( nNodesBot1 > p->pPars->nLutSize-1 ) // need to move bottom left-over to the top
        {
            while ( nNodesBot1 > p->pPars->nLutSize-1 )
                pNodesTop[nNodesTop++] = pNodesBot1[--nNodesBot1];
            assert( nNodesBot1 == p->pPars->nLutSize-1 );
        }
        assert( nNodesBot2 <= p->pPars->nLutSize );
        assert( nNodesBot1 <= p->pPars->nLutSize-1 );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        Strs[0].VarIns[i++] = Vec_IntSize(p->vDivSet)+1;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+2 + i-nNodesTop;
        Strs[0].Res = 0;
        nNodesDiff1 = p->pPars->nLutSize-1 - nNodesTop;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesBot1; i++ )
            Strs[1].VarIns[i] = pNodesBot1[i];
        Strs[1].VarIns[i++] = Vec_IntSize(p->vDivSet)+2;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[1].VarIns[i] = Vec_IntSize(p->vDivSet)+2+nNodesDiff1 + i-nNodesBot1;
        Strs[1].Res = 0;
        nNodesDiff2 = p->pPars->nLutSize-1 - nNodesBot1;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = nNodesBot2;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot2[i];
        Strs[2].Res = 0;

        nNodesDiff = nNodesDiff1 + nNodesDiff2;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot2;
            for ( i = 0; i < nNodesBot2; i++ )
                Strs[3+k].VarIns[i] = pNodesBot2[i];
            Strs[3+k].Res = 0;
            if ( k >= nNodesDiff1 )
                continue;
            Strs[3+k].nVarIns += nNodesBot1;
            for ( i = 0; i < nNodesBot1; i++ )
                Strs[3+k].VarIns[nNodesBot2 + i] = pNodesBot1[i];
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[4]++;
    }
    return RetValue;
}